

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

int Dar_LibCutMarkMffc(Aig_Man_t *p,Aig_Obj_t *pRoot,int nLeaves,float *pPower)

{
  ulong uVar1;
  Dar_Lib_t *pDVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  pDVar2 = s_DarLib;
  if (0 < nLeaves) {
    lVar4 = 0;
    do {
      uVar5 = *(ulong *)(pDVar2->pDatas->nLats + lVar4 + -0x15) & 0xfffffffffffffffe;
      uVar1 = *(ulong *)(uVar5 + 0x18);
      *(ulong *)(uVar5 + 0x18) =
           uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
      lVar4 = lVar4 + 0x18;
    } while ((ulong)(uint)nLeaves * 0x18 != lVar4);
    iVar3 = Aig_NodeMffcLabel(p,pRoot,pPower);
    pDVar2 = s_DarLib;
    if (0 < nLeaves) {
      lVar4 = 0;
      do {
        uVar5 = *(ulong *)(pDVar2->pDatas->nLats + lVar4 + -0x15) & 0xfffffffffffffffe;
        uVar1 = *(ulong *)(uVar5 + 0x18);
        *(ulong *)(uVar5 + 0x18) =
             uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 - 0x40U & 0xffffffc0);
        lVar4 = lVar4 + 0x18;
      } while ((ulong)(uint)nLeaves * 0x18 != lVar4);
    }
    return iVar3;
  }
  iVar3 = Aig_NodeMffcLabel(p,pRoot,pPower);
  return iVar3;
}

Assistant:

int Dar_LibCutMarkMffc( Aig_Man_t * p, Aig_Obj_t * pRoot, int nLeaves, float * pPower )
{
    int i, nNodes;
    // mark the cut leaves
    for ( i = 0; i < nLeaves; i++ )
        Aig_Regular(s_DarLib->pDatas[i].pFunc)->nRefs++;
    // label MFFC with current ID
    nNodes = Aig_NodeMffcLabel( p, pRoot, pPower );
    // unmark the cut leaves
    for ( i = 0; i < nLeaves; i++ )
        Aig_Regular(s_DarLib->pDatas[i].pFunc)->nRefs--;
    return nNodes;
}